

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_window * nk_find_window(nk_context *ctx,nk_hash hash,char *name)

{
  int iVar1;
  char *in_RDX;
  nk_hash in_ESI;
  long in_RDI;
  int max_len;
  nk_window *iter;
  nk_window *local_28;
  
  local_28 = *(nk_window **)(in_RDI + 0x3fb0);
  do {
    if (local_28 == (nk_window *)0x0) {
      return (nk_window *)0x0;
    }
    if (local_28->name == in_ESI) {
      iVar1 = nk_strlen(local_28->name_string);
      iVar1 = nk_stricmpn(local_28->name_string,in_RDX,iVar1);
      if (iVar1 == 0) {
        return local_28;
      }
    }
    local_28 = local_28->next;
  } while( true );
}

Assistant:

NK_INTERN struct nk_window*
nk_find_window(struct nk_context *ctx, nk_hash hash, const char *name)
{
    struct nk_window *iter;
    iter = ctx->begin;
    while (iter) {
        NK_ASSERT(iter != iter->next);
        if (iter->name == hash) {
            int max_len = nk_strlen(iter->name_string);
            if (!nk_stricmpn(iter->name_string, name, max_len))
                return iter;
        }
        iter = iter->next;
    }
    return 0;
}